

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O0

istream * operator>>(istream *is,Date *dd)

{
  istream *piVar1;
  ulong uVar2;
  Date local_38;
  char local_30;
  char local_2f;
  char local_2e;
  char local_2d;
  uint32_t local_2c;
  char ch4;
  char ch3;
  char ch2;
  char ch1;
  int d;
  int m;
  int y;
  Date *dd_local;
  istream *is_local;
  
  _m = dd;
  dd_local = (Date *)is;
  piVar1 = std::operator>>(is,&local_2d);
  piVar1 = (istream *)std::istream::operator>>(piVar1,&d);
  piVar1 = std::operator>>(piVar1,&local_2e);
  piVar1 = (istream *)std::istream::operator>>(piVar1,(int *)&ch4);
  piVar1 = std::operator>>(piVar1,&local_2f);
  piVar1 = (istream *)std::istream::operator>>(piVar1,(int *)&local_2c);
  std::operator>>(piVar1,&local_30);
  uVar2 = std::ios::operator!((ios *)((long)&dd_local->days + *(long *)(dd_local->days + -0x18)));
  if ((uVar2 & 1) == 0) {
    if ((((local_2d == '(') && (local_2e == ',')) && (local_2f == ',')) && (local_30 == ')')) {
      Date::Date(&local_38,d,_ch4,local_2c);
      _m->days = local_38.days;
      is_local = (istream *)dd_local;
    }
    else {
      std::ios::clear((int)dd_local + (int)*(undefined8 *)(dd_local->days + -0x18));
      is_local = (istream *)dd_local;
    }
  }
  else {
    is_local = (istream *)dd_local;
  }
  return is_local;
}

Assistant:

std::istream& operator>>(std::istream& is, Date& dd)
{
	int y, m, d;
	char ch1, ch2, ch3, ch4;
	is >> ch1 >> y >> ch2 >> m >> ch3 >> d >> ch4;
	if (!is) return is;
	if (ch1 != '(' || ch2 != ',' || ch3 != ',' || ch4 != ')') { // oops: format error
		is.clear(std::ios_base::failbit); // set the fail bit
		return is;
	}
	dd = Date(y, Month(m), d); // update dd
	return is;
}